

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O1

int loadSettings(Settings *s,json *inj,string *fjson)

{
  size_t sVar1;
  pointer pcVar2;
  string str;
  string str_00;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  key_type *pkVar6;
  reference pbVar7;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  time_t tVar8;
  ostream *poVar9;
  basic_ostream<char,_std::char_traits<char>_> *pbVar10;
  long lVar11;
  char *pcVar12;
  string *this;
  _Alloc_hider _Var13;
  char *__end;
  json *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  _Put_time<char> __f;
  _Put_time<char> __f_00;
  type val;
  string cmapName;
  string beforeId;
  string afterId;
  string typeId;
  string kernelId;
  string imapId;
  string allCmapsId;
  string cmapNameId;
  string fgpxId;
  string fnameId;
  string fitnyId;
  string fityId;
  string sampleId;
  string verbId;
  string mapTypeId;
  string gaussianAmpId;
  string invertMapId;
  string cmapFileId;
  string fitnxId;
  string fitxId;
  string marginId;
  string maxyId;
  string maxxId;
  string minxId;
  string radiusId;
  string sizeyId;
  string sizexId;
  string minyId;
  iterator it;
  uint in_stack_fffffffffffffaf8;
  uint uVar15;
  int in_stack_fffffffffffffafc;
  iterator in_stack_fffffffffffffb00;
  undefined2 in_stack_fffffffffffffb08;
  undefined1 in_stack_fffffffffffffb0a;
  undefined1 in_stack_fffffffffffffb0b;
  undefined1 in_stack_fffffffffffffb0c;
  undefined1 in_stack_fffffffffffffb0d;
  undefined1 in_stack_fffffffffffffb0e;
  undefined1 in_stack_fffffffffffffb0f;
  undefined1 in_stack_fffffffffffffb10;
  undefined1 in_stack_fffffffffffffb11;
  undefined1 in_stack_fffffffffffffb12;
  undefined5 in_stack_fffffffffffffb13;
  int local_4e8;
  undefined4 uStack_4e4;
  long lStack_4e0;
  char *local_4d8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_4d0;
  json *local_4c0;
  undefined4 local_4b8;
  uint local_4b4;
  uint local_4b0;
  uint local_4ac;
  tm *local_4a8;
  tm *local_4a0;
  long *local_498;
  long local_490;
  long local_488 [2];
  long *local_478;
  size_t local_470;
  long local_468 [2];
  long *local_458;
  size_t local_450;
  long local_448 [2];
  long *local_438;
  size_t local_430;
  long local_428 [2];
  long *local_418;
  size_t local_410;
  long local_408 [2];
  long *local_3f8;
  size_t local_3f0;
  long local_3e8 [2];
  long *local_3d8;
  size_t local_3d0;
  long local_3c8 [2];
  long *local_3b8;
  size_t local_3b0;
  long local_3a8 [2];
  long *local_398;
  size_t local_390;
  long local_388 [2];
  long *local_378;
  size_t local_370;
  long local_368 [2];
  long *local_358;
  size_t local_350;
  long local_348 [2];
  long *local_338;
  size_t local_330;
  long local_328 [2];
  long *local_318;
  size_t local_310;
  long local_308 [2];
  long *local_2f8;
  size_t local_2f0;
  long local_2e8 [2];
  string *local_2d8;
  long *local_2d0;
  size_t local_2c8;
  long local_2c0 [2];
  long *local_2b0;
  size_t local_2a8;
  long local_2a0 [2];
  long *local_290;
  size_t local_288;
  long local_280 [2];
  long *local_270;
  size_t local_268;
  long local_260 [2];
  long *local_250;
  size_t local_248;
  long local_240 [2];
  long *local_230;
  size_t local_228;
  long local_220 [2];
  long *local_210;
  size_t local_208;
  long local_200 [2];
  long *local_1f0;
  size_t local_1e8;
  long local_1e0 [2];
  long *local_1d0;
  size_t local_1c8;
  long local_1c0 [2];
  long *local_1b0;
  size_t local_1a8;
  long local_1a0 [2];
  long *local_190;
  size_t local_188;
  long local_180 [2];
  long *local_170;
  size_t local_168;
  long local_160 [2];
  long *local_150;
  size_t local_148;
  long local_140 [2];
  long *local_130;
  size_t local_128;
  long local_120 [2];
  time_t *local_110;
  string *local_108;
  string *local_100;
  double *local_f8;
  string local_f0;
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  string local_90;
  string local_70;
  iterator local_50;
  
  s->nx = 0x500;
  s->ny = 0x2d0;
  s->verb = 0;
  s->sampling = autosample;
  s->r = 10;
  s->margin = 0.0;
  s->fitx = false;
  s->fity = false;
  s->fitnx = false;
  s->fitny = false;
  s->minx = 0.0;
  s->maxx = 0.0;
  s->miny = 0.0;
  s->maxy = 0.0;
  local_4c0 = inj;
  std::__cxx11::string::find_last_of((char *)fjson,0x1439a5,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&stack0xfffffffffffffaf8,(ulong)fjson);
  local_100 = (string *)&s->fname;
  std::__cxx11::string::operator=(local_100,(string *)&stack0xfffffffffffffaf8);
  if ((undefined1 *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8) !=
      &stack0xfffffffffffffb08) {
    operator_delete((undefined1 *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                    CONCAT17(in_stack_fffffffffffffb0f,
                             CONCAT16(in_stack_fffffffffffffb0e,
                                      CONCAT15(in_stack_fffffffffffffb0d,
                                               CONCAT14(in_stack_fffffffffffffb0c,
                                                        CONCAT13(in_stack_fffffffffffffb0b,
                                                                 CONCAT12(in_stack_fffffffffffffb0a,
                                                                          in_stack_fffffffffffffb08)
                                                                ))))) + 1);
  }
  local_108 = (string *)&s->fgpx;
  std::__cxx11::string::_M_replace((ulong)local_108,0,(char *)(s->fgpx)._M_string_length,0x143b11);
  local_2d8 = (string *)&s->cmapFile;
  std::__cxx11::string::_M_replace
            ((ulong)local_2d8,0,(char *)(s->cmapFile)._M_string_length,0x143a21);
  local_498 = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"","");
  s->allCmaps = false;
  s->gka = 10.0;
  s->kernel = cone;
  s->filterType = false;
  s->filterAfter = false;
  s->filterBefore = false;
  s->after = 0;
  s->before = 0;
  s->mapType = heat;
  local_150 = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Image size x","");
  local_170 = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Image size y","");
  this_00 = local_4c0;
  local_2f8 = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Verbosity","");
  local_318 = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"Sampling","");
  local_190 = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Kernel radius","");
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"Min x","");
  local_130 = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Min y","");
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"Max x","");
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"Max y","");
  local_210 = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Margin","");
  local_230 = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"Fit x","");
  local_338 = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"Fit y","");
  local_250 = local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Fit nx","");
  local_358 = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"Fit ny","");
  local_378 = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"File name prefix","");
  local_398 = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"GPX files","");
  local_270 = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Colormap file","");
  local_3b8 = local_3a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"Colormap name","");
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"All colormaps","");
  local_3f8 = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"Color map","");
  local_290 = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Invert color map","");
  local_2b0 = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Gaussian amplitude","");
  local_418 = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"Kernel","");
  local_438 = local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"Type","");
  local_458 = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"After","");
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"Before","");
  local_2d0 = local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"Map type","");
  local_f8 = &s->minx;
  local_110 = &s->after;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::begin(&local_50,this_00);
  _Var13._M_p = (pointer)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8);
  local_4a8 = &s->beforetm;
  local_4a0 = &s->aftertm;
  local_4b0 = 0;
  local_4b4 = 0;
  local_4b8 = 0;
  local_4ac = 0;
  while( true ) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end((iterator *)&stack0xfffffffffffffaf8,this_00);
    bVar4 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&local_50,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&stack0xfffffffffffffaf8);
    if (bVar4) break;
    pkVar6 = nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::key(&local_50);
    sVar1 = pkVar6->_M_string_length;
    if ((sVar1 == local_148) &&
       ((sVar1 == 0 || (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_150,sVar1), iVar5 == 0)))) {
      pbVar7 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&local_50);
      iVar5 = (int)((ulong)_Var13._M_p >> 0x20);
      if (2 < (byte)(pbVar7->m_type - number_integer)) goto LAB_001098b4;
      pbVar7 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&local_50);
      uVar15 = 0;
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                (pbVar7,(int *)&stack0xfffffffffffffaf8);
      _Var13._M_p = (pointer)CONCAT44(iVar5,uVar15);
      s->nx = uVar15;
    }
    else {
LAB_001098b4:
      pkVar6 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::key(&local_50);
      sVar1 = pkVar6->_M_string_length;
      if ((sVar1 == local_168) &&
         ((sVar1 == 0 || (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_170,sVar1), iVar5 == 0)))) {
        pbVar7 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&local_50);
        iVar5 = (int)((ulong)_Var13._M_p >> 0x20);
        if ((byte)(pbVar7->m_type - number_integer) < 3) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&local_50);
          uVar15 = 0;
          nlohmann::detail::
          from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                    (pbVar7,(int *)&stack0xfffffffffffffaf8);
          _Var13._M_p = (pointer)CONCAT44(iVar5,uVar15);
          s->ny = uVar15;
          goto LAB_0010a4bf;
        }
      }
      pkVar6 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::key(&local_50);
      sVar1 = pkVar6->_M_string_length;
      if ((sVar1 == local_2f0) &&
         ((sVar1 == 0 || (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_2f8,sVar1), iVar5 == 0)))) {
        pbVar7 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&local_50);
        iVar5 = (int)((ulong)_Var13._M_p >> 0x20);
        if ((byte)(pbVar7->m_type - number_integer) < 3) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&local_50);
          uVar15 = 0;
          nlohmann::detail::
          from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                    (pbVar7,(int *)&stack0xfffffffffffffaf8);
          _Var13._M_p = (pointer)CONCAT44(iVar5,uVar15);
          s->verb = uVar15;
          goto LAB_0010a4bf;
        }
      }
      pkVar6 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::key(&local_50);
      sVar1 = pkVar6->_M_string_length;
      if (((sVar1 == local_310) &&
          ((sVar1 == 0 || (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_318,sVar1), iVar5 == 0))))
         && ((pbVar7 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::operator*(&local_50), (byte)(pbVar7->m_type - number_integer) < 3 ||
             (pbVar7 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::operator*(&local_50), pbVar7->m_type == string)))) {
        pbVar7 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&local_50);
        if ((byte)(pbVar7->m_type - number_integer) < 3) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&local_50);
          nlohmann::detail::
          get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_int,_0>
                    (pbVar7,(uint *)&stack0xfffffffffffffaf8);
          s->sampling = (Sampling)_Var13._M_p;
        }
        else {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&local_50);
          in_stack_fffffffffffffb08 = 0x6f70;
          in_stack_fffffffffffffb0a = 'i';
          in_stack_fffffffffffffb0b = 'n';
          in_stack_fffffffffffffb0c = 't';
          in_stack_fffffffffffffb0d = 'w';
          in_stack_fffffffffffffb0e = 'i';
          in_stack_fffffffffffffb0f = 's';
          in_stack_fffffffffffffb10 = 'e';
          in_stack_fffffffffffffb00._M_node = (_Base_ptr)0x9;
          in_stack_fffffffffffffb11 = '\0';
          local_4d0.m_type = null;
          local_4d0.m_value.object = (object_t *)0x0;
          _Var13._M_p = (pointer)&stack0xfffffffffffffb08;
          nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
          construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (&local_4d0,(string_t *)&stack0xfffffffffffffaf8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant(&local_4d0,true);
          bVar4 = nlohmann::operator==(pbVar7,&local_4d0);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json(&local_4d0);
          if ((pointer)_Var13._M_p != (pointer)&stack0xfffffffffffffb08) {
            operator_delete(_Var13._M_p,
                            CONCAT17(in_stack_fffffffffffffb0f,
                                     CONCAT16(in_stack_fffffffffffffb0e,
                                              CONCAT15(in_stack_fffffffffffffb0d,
                                                       CONCAT14(in_stack_fffffffffffffb0c,
                                                                CONCAT13(in_stack_fffffffffffffb0b,
                                                                         CONCAT12(
                                                  in_stack_fffffffffffffb0a,
                                                  in_stack_fffffffffffffb08)))))) + 1);
          }
          if (bVar4) {
            s->sampling = pointwise;
            this_00 = local_4c0;
          }
          else {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&local_50);
            in_stack_fffffffffffffb0c = 'a';
            in_stack_fffffffffffffb0d = 'r';
            in_stack_fffffffffffffb08 = 0x696c;
            in_stack_fffffffffffffb0a = 'n';
            in_stack_fffffffffffffb0b = 'e';
            in_stack_fffffffffffffb00._M_node = (_Base_ptr)0x6;
            in_stack_fffffffffffffb0e = '\0';
            local_4d0.m_type = null;
            local_4d0.m_value.object = (object_t *)0x0;
            _Var13._M_p = (pointer)&stack0xfffffffffffffb08;
            nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
            construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      (&local_4d0,(string_t *)&stack0xfffffffffffffaf8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant(&local_4d0,true);
            bVar4 = nlohmann::operator==(pbVar7,&local_4d0);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json(&local_4d0);
            if ((pointer)_Var13._M_p != (pointer)&stack0xfffffffffffffb08) {
              operator_delete(_Var13._M_p,
                              CONCAT17(in_stack_fffffffffffffb0f,
                                       CONCAT16(in_stack_fffffffffffffb0e,
                                                CONCAT15(in_stack_fffffffffffffb0d,
                                                         CONCAT14(in_stack_fffffffffffffb0c,
                                                                  CONCAT13(in_stack_fffffffffffffb0b
                                                                           ,CONCAT12(
                                                  in_stack_fffffffffffffb0a,
                                                  in_stack_fffffffffffffb08)))))) + 1);
            }
            if (bVar4) {
              s->sampling = linear;
              this_00 = local_4c0;
            }
            else {
              pbVar7 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::operator*(&local_50);
              in_stack_fffffffffffffb08 = 0x7561;
              in_stack_fffffffffffffb0a = 't';
              in_stack_fffffffffffffb0b = 'o';
              in_stack_fffffffffffffb0c = 's';
              in_stack_fffffffffffffb0d = 'a';
              in_stack_fffffffffffffb0e = 'm';
              in_stack_fffffffffffffb0f = 'p';
              in_stack_fffffffffffffb10 = 'l';
              in_stack_fffffffffffffb11 = 'e';
              in_stack_fffffffffffffb00._M_node = (_Base_ptr)0xa;
              in_stack_fffffffffffffb12 = '\0';
              local_4d0.m_type = null;
              local_4d0.m_value.object = (object_t *)0x0;
              _Var13._M_p = (pointer)&stack0xfffffffffffffb08;
              nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
              construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        (&local_4d0,(string_t *)&stack0xfffffffffffffaf8);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::assert_invariant(&local_4d0,true);
              bVar4 = nlohmann::operator==(pbVar7,&local_4d0);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::~basic_json(&local_4d0);
              if ((pointer)_Var13._M_p != (pointer)&stack0xfffffffffffffb08) {
                operator_delete(_Var13._M_p,
                                CONCAT17(in_stack_fffffffffffffb0f,
                                         CONCAT16(in_stack_fffffffffffffb0e,
                                                  CONCAT15(in_stack_fffffffffffffb0d,
                                                           CONCAT14(in_stack_fffffffffffffb0c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffb0b,
                                                  CONCAT12(in_stack_fffffffffffffb0a,
                                                           in_stack_fffffffffffffb08)))))) + 1);
              }
              this_00 = local_4c0;
              if (bVar4) {
                s->sampling = autosample;
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\nWarning:  unknown sampling value ",0x22);
                pbVar7 = nlohmann::detail::
                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::operator*(&local_50);
                poVar9 = nlohmann::operator<<((ostream *)&std::cout,pbVar7);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,", defaulting to \"",0x11)
                ;
                _Var13._M_p = &stack0xfffffffffffffb08;
                in_stack_fffffffffffffb08 = 0x7561;
                in_stack_fffffffffffffb0a = 't';
                in_stack_fffffffffffffb0b = 'o';
                in_stack_fffffffffffffb0c = 's';
                in_stack_fffffffffffffb0d = 'a';
                in_stack_fffffffffffffb0e = 'm';
                in_stack_fffffffffffffb0f = 'p';
                in_stack_fffffffffffffb10 = 'l';
                in_stack_fffffffffffffb11 = 'e';
                in_stack_fffffffffffffb00._M_node = (_Base_ptr)0xa;
                in_stack_fffffffffffffb12 = '\0';
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,_Var13._M_p,10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"\n",2);
LAB_0010a860:
                if ((pointer)_Var13._M_p != (pointer)&stack0xfffffffffffffb08) {
LAB_0010a030:
                  operator_delete(_Var13._M_p,
                                  CONCAT17(in_stack_fffffffffffffb0f,
                                           CONCAT16(in_stack_fffffffffffffb0e,
                                                    CONCAT15(in_stack_fffffffffffffb0d,
                                                             CONCAT14(in_stack_fffffffffffffb0c,
                                                                      CONCAT13(
                                                  in_stack_fffffffffffffb0b,
                                                  CONCAT12(in_stack_fffffffffffffb0a,
                                                           in_stack_fffffffffffffb08)))))) + 1);
                }
              }
            }
          }
        }
      }
      else {
        pkVar6 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key(&local_50);
        sVar1 = pkVar6->_M_string_length;
        if ((sVar1 == local_188) &&
           ((sVar1 == 0 || (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_190,sVar1), iVar5 == 0))))
        {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&local_50);
          iVar5 = (int)((ulong)_Var13._M_p >> 0x20);
          if ((byte)(pbVar7->m_type - number_integer) < 3) {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&local_50);
            uVar15 = 0;
            nlohmann::detail::
            from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                      (pbVar7,(int *)&stack0xfffffffffffffaf8);
            _Var13._M_p = (pointer)CONCAT44(iVar5,uVar15);
            s->r = uVar15;
            goto LAB_0010a4bf;
          }
        }
        pkVar6 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key(&local_50);
        sVar1 = pkVar6->_M_string_length;
        if ((sVar1 == local_1a8) &&
           (((sVar1 == 0 || (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_1b0,sVar1), iVar5 == 0))
            && (pbVar7 = nlohmann::detail::
                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::operator*(&local_50), (byte)(pbVar7->m_type - number_integer) < 3)))) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&local_50);
          uVar15 = 0;
          iVar5 = 0;
          nlohmann::detail::
          get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                    (pbVar7,(double *)&stack0xfffffffffffffaf8);
          _Var13._M_p = (pointer)CONCAT44(iVar5,uVar15);
          *local_f8 = (double)_Var13._M_p;
          local_4ac = (uint)CONCAT71((int7)((ulong)local_f8 >> 8),1);
        }
        else {
          pkVar6 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::key(&local_50);
          sVar1 = pkVar6->_M_string_length;
          if (((sVar1 == local_128) &&
              ((sVar1 == 0 || (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_130,sVar1), iVar5 == 0)
               ))) && (pbVar7 = nlohmann::detail::
                                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ::operator*(&local_50), (byte)(pbVar7->m_type - number_integer) < 3)
             ) {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&local_50);
            uVar15 = 0;
            iVar5 = 0;
            nlohmann::detail::
            get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                      (pbVar7,(double *)&stack0xfffffffffffffaf8);
            _Var13._M_p = (pointer)CONCAT44(iVar5,uVar15);
            s->miny = (double)_Var13._M_p;
            local_4b0 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          }
          else {
            pkVar6 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::key(&local_50);
            sVar1 = pkVar6->_M_string_length;
            if (((sVar1 == local_1c8) &&
                ((sVar1 == 0 ||
                 (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_1d0,sVar1), iVar5 == 0)))) &&
               (pbVar7 = nlohmann::detail::
                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::operator*(&local_50), (byte)(pbVar7->m_type - number_integer) < 3)) {
              pbVar7 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::operator*(&local_50);
              uVar15 = 0;
              iVar5 = 0;
              nlohmann::detail::
              get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                        (pbVar7,(double *)&stack0xfffffffffffffaf8);
              _Var13._M_p = (pointer)CONCAT44(iVar5,uVar15);
              s->maxx = (double)_Var13._M_p;
              local_4b4 = (uint)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
            }
            else {
              pkVar6 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::key(&local_50);
              sVar1 = pkVar6->_M_string_length;
              if ((sVar1 == local_1e8) &&
                 (((sVar1 == 0 ||
                   (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_1f0,sVar1), iVar5 == 0)) &&
                  (pbVar7 = nlohmann::detail::
                            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ::operator*(&local_50), (byte)(pbVar7->m_type - number_integer) < 3))))
              {
                pbVar7 = nlohmann::detail::
                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::operator*(&local_50);
                uVar15 = 0;
                iVar5 = 0;
                nlohmann::detail::
                get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                          (pbVar7,(double *)&stack0xfffffffffffffaf8);
                _Var13._M_p = (pointer)CONCAT44(iVar5,uVar15);
                s->maxy = (double)_Var13._M_p;
                local_4b8 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1);
              }
              else {
                pkVar6 = nlohmann::detail::
                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::key(&local_50);
                sVar1 = pkVar6->_M_string_length;
                if (((sVar1 == local_208) &&
                    ((sVar1 == 0 ||
                     (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_210,sVar1), iVar5 == 0)))) &&
                   (pbVar7 = nlohmann::detail::
                             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ::operator*(&local_50), (byte)(pbVar7->m_type - number_integer) < 3)) {
                  pbVar7 = nlohmann::detail::
                           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::operator*(&local_50);
                  uVar15 = 0;
                  iVar5 = 0;
                  nlohmann::detail::
                  get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                            (pbVar7,(double *)&stack0xfffffffffffffaf8);
                  _Var13._M_p = (pointer)CONCAT44(iVar5,uVar15);
                  s->margin = (double)_Var13._M_p;
                }
                else {
                  pkVar6 = nlohmann::detail::
                           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::key(&local_50);
                  sVar1 = pkVar6->_M_string_length;
                  if (((sVar1 == local_228) &&
                      ((sVar1 == 0 ||
                       (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_230,sVar1), iVar5 == 0)))) &&
                     (pbVar7 = nlohmann::detail::
                               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ::operator*(&local_50), pbVar7->m_type == boolean)) {
                    pbVar7 = nlohmann::detail::
                             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ::operator*(&local_50);
                    iVar5 = (int)((ulong)_Var13._M_p >> 0x20);
                    uVar15 = (uint)_Var13._M_p & 0xffffff00;
                    nlohmann::detail::
                    from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                              (pbVar7,(boolean_t *)&stack0xfffffffffffffaf8);
                    _Var13._M_p = (pointer)CONCAT44(iVar5,uVar15);
                    s->fitx = (bool)SUB41(uVar15,0);
                  }
                  else {
                    pkVar6 = nlohmann::detail::
                             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ::key(&local_50);
                    sVar1 = pkVar6->_M_string_length;
                    if ((sVar1 == local_330) &&
                       (((sVar1 == 0 ||
                         (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_338,sVar1), iVar5 == 0)) &&
                        (pbVar7 = nlohmann::detail::
                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  ::operator*(&local_50), pbVar7->m_type == boolean)))) {
                      pbVar7 = nlohmann::detail::
                               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ::operator*(&local_50);
                      iVar5 = (int)((ulong)_Var13._M_p >> 0x20);
                      uVar15 = (uint)_Var13._M_p & 0xffffff00;
                      nlohmann::detail::
                      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                (pbVar7,(boolean_t *)&stack0xfffffffffffffaf8);
                      _Var13._M_p = (pointer)CONCAT44(iVar5,uVar15);
                      s->fity = (bool)SUB41(uVar15,0);
                    }
                    else {
                      pkVar6 = nlohmann::detail::
                               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ::key(&local_50);
                      sVar1 = pkVar6->_M_string_length;
                      if (((sVar1 == local_248) &&
                          ((sVar1 == 0 ||
                           (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_250,sVar1), iVar5 == 0))))
                         && (pbVar7 = nlohmann::detail::
                                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      ::operator*(&local_50), pbVar7->m_type == boolean)) {
                        pbVar7 = nlohmann::detail::
                                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 ::operator*(&local_50);
                        iVar5 = (int)((ulong)_Var13._M_p >> 0x20);
                        uVar15 = (uint)_Var13._M_p & 0xffffff00;
                        nlohmann::detail::
                        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                  (pbVar7,(boolean_t *)&stack0xfffffffffffffaf8);
                        _Var13._M_p = (pointer)CONCAT44(iVar5,uVar15);
                        s->fitnx = (bool)SUB41(uVar15,0);
                      }
                      else {
                        pkVar6 = nlohmann::detail::
                                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 ::key(&local_50);
                        sVar1 = pkVar6->_M_string_length;
                        if (((sVar1 == local_350) &&
                            ((sVar1 == 0 ||
                             (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_358,sVar1), iVar5 == 0))
                            )) && (pbVar7 = nlohmann::detail::
                                            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            ::operator*(&local_50), pbVar7->m_type == boolean)) {
                          pbVar7 = nlohmann::detail::
                                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   ::operator*(&local_50);
                          iVar5 = (int)((ulong)_Var13._M_p >> 0x20);
                          uVar15 = (uint)_Var13._M_p & 0xffffff00;
                          nlohmann::detail::
                          from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                    (pbVar7,(boolean_t *)&stack0xfffffffffffffaf8);
                          _Var13._M_p = (pointer)CONCAT44(iVar5,uVar15);
                          s->fitny = (bool)SUB41(uVar15,0);
                        }
                        else {
                          pkVar6 = nlohmann::detail::
                                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   ::key(&local_50);
                          sVar1 = pkVar6->_M_string_length;
                          if ((sVar1 == local_370) &&
                             (((sVar1 == 0 ||
                               (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_378,sVar1), iVar5 == 0
                               )) && (pbVar7 = nlohmann::detail::
                                               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                               ::operator*(&local_50), pbVar7->m_type == string))))
                          {
                            pbVar7 = nlohmann::detail::
                                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                     ::operator*(&local_50);
                            nlohmann::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            ::
                            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                      (&stack0xfffffffffffffaf8,pbVar7);
                            this = local_100;
                          }
                          else {
                            pkVar6 = nlohmann::detail::
                                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                     ::key(&local_50);
                            sVar1 = pkVar6->_M_string_length;
                            if (((sVar1 == local_390) &&
                                ((sVar1 == 0 ||
                                 (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_398,sVar1),
                                 iVar5 == 0)))) &&
                               (pbVar7 = nlohmann::detail::
                                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                         ::operator*(&local_50), pbVar7->m_type == string)) {
                              pbVar7 = nlohmann::detail::
                                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                       ::operator*(&local_50);
                              nlohmann::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              ::
                              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                        (&stack0xfffffffffffffaf8,pbVar7);
                              this = local_108;
                            }
                            else {
                              pkVar6 = nlohmann::detail::
                                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                       ::key(&local_50);
                              sVar1 = pkVar6->_M_string_length;
                              if (((sVar1 == local_268) &&
                                  ((sVar1 == 0 ||
                                   (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_270,sVar1),
                                   iVar5 == 0)))) &&
                                 (pbVar7 = nlohmann::detail::
                                           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                           ::operator*(&local_50), pbVar7->m_type == string)) {
                                pbVar7 = nlohmann::detail::
                                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                         ::operator*(&local_50);
                                nlohmann::
                                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                ::
                                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                          (&stack0xfffffffffffffaf8,pbVar7);
                                this = local_2d8;
                              }
                              else {
                                pkVar6 = nlohmann::detail::
                                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                         ::key(&local_50);
                                sVar1 = pkVar6->_M_string_length;
                                if ((sVar1 != local_3b0) ||
                                   (((sVar1 != 0 &&
                                     (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_3b8,sVar1),
                                     iVar5 != 0)) ||
                                    (pbVar7 = nlohmann::detail::
                                              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                              ::operator*(&local_50), pbVar7->m_type != string)))) {
                                  pkVar6 = nlohmann::detail::
                                           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                           ::key(&local_50);
                                  sVar1 = pkVar6->_M_string_length;
                                  if ((sVar1 == local_3f0) &&
                                     ((sVar1 == 0 ||
                                      (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_3f8,sVar1),
                                      iVar5 == 0)))) {
                                    pbVar7 = nlohmann::detail::
                                             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                             ::operator*(&local_50);
                                    iVar5 = (int)((ulong)_Var13._M_p >> 0x20);
                                    if ((byte)(pbVar7->m_type - number_integer) < 3) {
                                      pbVar7 = nlohmann::detail::
                                               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                               ::operator*(&local_50);
                                      uVar15 = 0;
                                      nlohmann::detail::
                                      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                                                (pbVar7,(int *)&stack0xfffffffffffffaf8);
                                      _Var13._M_p = (pointer)CONCAT44(iVar5,uVar15);
                                      (s->c).imap = uVar15;
                                      goto LAB_0010a4bf;
                                    }
                                  }
                                  pkVar6 = nlohmann::detail::
                                           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                           ::key(&local_50);
                                  sVar1 = pkVar6->_M_string_length;
                                  if (((sVar1 == local_288) &&
                                      ((sVar1 == 0 ||
                                       (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_290,sVar1),
                                       iVar5 == 0)))) &&
                                     (pbVar7 = nlohmann::detail::
                                               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                               ::operator*(&local_50), pbVar7->m_type == boolean)) {
                                    pbVar7 = nlohmann::detail::
                                             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                             ::operator*(&local_50);
                                    iVar5 = (int)((ulong)_Var13._M_p >> 0x20);
                                    uVar15 = (uint)_Var13._M_p & 0xffffff00;
                                    nlohmann::detail::
                                    from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                              (pbVar7,(boolean_t *)&stack0xfffffffffffffaf8);
                                    _Var13._M_p = (pointer)CONCAT44(iVar5,uVar15);
                                    (s->c).inv = (bool)SUB41(uVar15,0);
                                  }
                                  else {
                                    pkVar6 = nlohmann::detail::
                                             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                             ::key(&local_50);
                                    sVar1 = pkVar6->_M_string_length;
                                    if ((sVar1 == local_3d0) &&
                                       (((sVar1 == 0 ||
                                         (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_3d8,sVar1),
                                         iVar5 == 0)) &&
                                        (pbVar7 = nlohmann::detail::
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50), pbVar7->m_type == boolean)
                                        ))) {
                                      pbVar7 = nlohmann::detail::
                                               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                               ::operator*(&local_50);
                                      iVar5 = (int)((ulong)_Var13._M_p >> 0x20);
                                      uVar15 = (uint)_Var13._M_p & 0xffffff00;
                                      nlohmann::detail::
                                      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                                (pbVar7,(boolean_t *)&stack0xfffffffffffffaf8);
                                      _Var13._M_p = (pointer)CONCAT44(iVar5,uVar15);
                                      s->allCmaps = (bool)SUB41(uVar15,0);
                                    }
                                    else {
                                      pkVar6 = nlohmann::detail::
                                               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                               ::key(&local_50);
                                      sVar1 = pkVar6->_M_string_length;
                                      if (((sVar1 == local_2a8) &&
                                          ((sVar1 == 0 ||
                                           (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_2b0,sVar1)
                                           , iVar5 == 0)))) &&
                                         (pbVar7 = nlohmann::detail::
                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50),
                                         (byte)(pbVar7->m_type - number_integer) < 3)) {
                                        pbVar7 = nlohmann::detail::
                                                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                 ::operator*(&local_50);
                                        uVar15 = 0;
                                        iVar5 = 0;
                                        nlohmann::detail::
                                        get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                                                  (pbVar7,(double *)&stack0xfffffffffffffaf8);
                                        _Var13._M_p = (pointer)CONCAT44(iVar5,uVar15);
                                        s->gka = (double)_Var13._M_p;
                                      }
                                      else {
                                        pkVar6 = nlohmann::detail::
                                                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                 ::key(&local_50);
                                        sVar1 = pkVar6->_M_string_length;
                                        if (((sVar1 == local_410) &&
                                            ((sVar1 == 0 ||
                                             (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_418,
                                                           sVar1), iVar5 == 0)))) &&
                                           (pbVar7 = nlohmann::detail::
                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50), pbVar7->m_type == string))
                                        {
                                          pbVar7 = nlohmann::detail::
                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                          in_stack_fffffffffffffb0c = 'm';
                                          in_stack_fffffffffffffb0d = 'i';
                                          in_stack_fffffffffffffb0e = 'd';
                                          in_stack_fffffffffffffb08 = 0x7970;
                                          in_stack_fffffffffffffb0a = 'r';
                                          in_stack_fffffffffffffb0b = 'a';
                                          in_stack_fffffffffffffb00._M_node = (_Base_ptr)0x7;
                                          in_stack_fffffffffffffb0f = '\0';
                                          _Var13._M_p = (pointer)&stack0xfffffffffffffb08;
                                          nlohmann::
                                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                          ::
                                          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                    (&local_4d0,
                                                     (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                          bVar4 = nlohmann::operator==(pbVar7,&local_4d0);
                                          nlohmann::
                                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                          ::~basic_json(&local_4d0);
                                          if ((pointer)_Var13._M_p !=
                                              (pointer)&stack0xfffffffffffffb08) {
                                            operator_delete(_Var13._M_p,
                                                            CONCAT17(in_stack_fffffffffffffb0f,
                                                                     CONCAT16(
                                                  in_stack_fffffffffffffb0e,
                                                  CONCAT15(in_stack_fffffffffffffb0d,
                                                           CONCAT14(in_stack_fffffffffffffb0c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffb0b,
                                                  CONCAT12(in_stack_fffffffffffffb0a,
                                                           in_stack_fffffffffffffb08)))))) + 1);
                                          }
                                          if (bVar4) {
                                            s->kernel = pyramid;
                                            this_00 = local_4c0;
                                          }
                                          else {
                                            pbVar7 = nlohmann::detail::
                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                            in_stack_fffffffffffffb08 = 0x7963;
                                            in_stack_fffffffffffffb0a = 'l';
                                            in_stack_fffffffffffffb0b = 'i';
                                            in_stack_fffffffffffffb0c = 'n';
                                            in_stack_fffffffffffffb0d = 'd';
                                            in_stack_fffffffffffffb0e = 'e';
                                            in_stack_fffffffffffffb0f = 'r';
                                            in_stack_fffffffffffffb00._M_node = (_Base_ptr)0x8;
                                            in_stack_fffffffffffffb10 = false;
                                            _Var13._M_p = (pointer)&stack0xfffffffffffffb08;
                                            nlohmann::
                                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                            ::
                                            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                      (&local_4d0,
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                            bVar4 = nlohmann::operator==(pbVar7,&local_4d0);
                                            nlohmann::
                                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                            ::~basic_json(&local_4d0);
                                            if ((pointer)_Var13._M_p !=
                                                (pointer)&stack0xfffffffffffffb08) {
                                              operator_delete(_Var13._M_p,
                                                              CONCAT17(in_stack_fffffffffffffb0f,
                                                                       CONCAT16(
                                                  in_stack_fffffffffffffb0e,
                                                  CONCAT15(in_stack_fffffffffffffb0d,
                                                           CONCAT14(in_stack_fffffffffffffb0c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffb0b,
                                                  CONCAT12(in_stack_fffffffffffffb0a,
                                                           in_stack_fffffffffffffb08)))))) + 1);
                                            }
                                            if (bVar4) {
                                              s->kernel = cylinder;
                                              this_00 = local_4c0;
                                            }
                                            else {
                                              pbVar7 = nlohmann::detail::
                                                                                                              
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                              in_stack_fffffffffffffb08 = 0x6167;
                                              in_stack_fffffffffffffb0a = 'u';
                                              in_stack_fffffffffffffb0b = 's';
                                              in_stack_fffffffffffffb0c = 's';
                                              in_stack_fffffffffffffb0d = 'i';
                                              in_stack_fffffffffffffb0e = 'a';
                                              in_stack_fffffffffffffb0f = 'n';
                                              in_stack_fffffffffffffb00._M_node = (_Base_ptr)0x8;
                                              in_stack_fffffffffffffb10 = false;
                                              _Var13._M_p = (pointer)&stack0xfffffffffffffb08;
                                              nlohmann::
                                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                              ::
                                              basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                        (&local_4d0,
                                                         (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                              bVar4 = nlohmann::operator==(pbVar7,&local_4d0);
                                              nlohmann::
                                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                              ::~basic_json(&local_4d0);
                                              if ((pointer)_Var13._M_p !=
                                                  (pointer)&stack0xfffffffffffffb08) {
                                                operator_delete(_Var13._M_p,
                                                                CONCAT17(in_stack_fffffffffffffb0f,
                                                                         CONCAT16(
                                                  in_stack_fffffffffffffb0e,
                                                  CONCAT15(in_stack_fffffffffffffb0d,
                                                           CONCAT14(in_stack_fffffffffffffb0c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffb0b,
                                                  CONCAT12(in_stack_fffffffffffffb0a,
                                                           in_stack_fffffffffffffb08)))))) + 1);
                                              }
                                              if (bVar4) {
                                                s->kernel = gaussian;
                                                this_00 = local_4c0;
                                              }
                                              else {
                                                pbVar7 = nlohmann::detail::
                                                                                                                  
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                in_stack_fffffffffffffb08 = 0x6f63;
                                                in_stack_fffffffffffffb0a = 'n';
                                                in_stack_fffffffffffffb0b = 'e';
                                                in_stack_fffffffffffffb00._M_node = (_Base_ptr)0x4;
                                                in_stack_fffffffffffffb0c = '\0';
                                                _Var13._M_p = (pointer)&stack0xfffffffffffffb08;
                                                nlohmann::
                                                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                ::
                                                basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                          (&local_4d0,
                                                           (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                                bVar4 = nlohmann::operator==(pbVar7,&local_4d0);
                                                nlohmann::
                                                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                ::~basic_json(&local_4d0);
                                                if ((pointer)_Var13._M_p !=
                                                    (pointer)&stack0xfffffffffffffb08) {
                                                  operator_delete(_Var13._M_p,
                                                                  CONCAT17(in_stack_fffffffffffffb0f
                                                                           ,CONCAT16(
                                                  in_stack_fffffffffffffb0e,
                                                  CONCAT15(in_stack_fffffffffffffb0d,
                                                           CONCAT14(in_stack_fffffffffffffb0c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffb0b,
                                                  CONCAT12(in_stack_fffffffffffffb0a,
                                                           in_stack_fffffffffffffb08)))))) + 1);
                                                }
                                                this_00 = local_4c0;
                                                if (!bVar4) {
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                             "\nWarning:  unknown kernel value ",
                                                             0x20);
                                                  pbVar7 = nlohmann::detail::
                                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  poVar9 = nlohmann::operator<<
                                                                     ((ostream *)&std::cout,pbVar7);
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            (poVar9,", defaulting to \"",0x11);
                                                  _Var13._M_p = &stack0xfffffffffffffb08;
                                                  in_stack_fffffffffffffb08 = 0x6f63;
                                                  in_stack_fffffffffffffb0a = 'n';
                                                  in_stack_fffffffffffffb0b = 'e';
                                                  in_stack_fffffffffffffb00._M_node = (_Base_ptr)0x4
                                                  ;
                                                  in_stack_fffffffffffffb0c = '\0';
                                                  poVar9 = std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            (poVar9,_Var13._M_p,4);
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            (poVar9,"\"\n",2);
                                                  goto LAB_0010a860;
                                                }
                                                s->kernel = cone;
                                              }
                                            }
                                          }
                                        }
                                        else {
                                          pkVar6 = nlohmann::detail::
                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::key(&local_50);
                                          sVar1 = pkVar6->_M_string_length;
                                          if ((sVar1 == local_430) &&
                                             (((sVar1 == 0 ||
                                               (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_438,
                                                             sVar1), iVar5 == 0)) &&
                                              (pbVar7 = nlohmann::detail::
                                                                                                                
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50), pbVar7->m_type == string))
                                             )) {
                                            s->filterType = true;
                                            pbVar7 = nlohmann::detail::
                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                            in_stack_fffffffffffffb08 = 0x6948;
                                            in_stack_fffffffffffffb0a = 'k';
                                            in_stack_fffffffffffffb0b = 'e';
                                            in_stack_fffffffffffffb00._M_node = (_Base_ptr)0x4;
                                            in_stack_fffffffffffffb0c = '\0';
                                            _Var13._M_p = (pointer)&stack0xfffffffffffffb08;
                                            nlohmann::
                                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                            ::
                                            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                      (&local_4d0,
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                            bVar4 = nlohmann::operator==(pbVar7,&local_4d0);
                                            nlohmann::
                                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                            ::~basic_json(&local_4d0);
                                            if ((pointer)_Var13._M_p !=
                                                (pointer)&stack0xfffffffffffffb08) {
                                              operator_delete(_Var13._M_p,
                                                              CONCAT17(in_stack_fffffffffffffb0f,
                                                                       CONCAT16(
                                                  in_stack_fffffffffffffb0e,
                                                  CONCAT15(in_stack_fffffffffffffb0d,
                                                           CONCAT14(in_stack_fffffffffffffb0c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffb0b,
                                                  CONCAT12(in_stack_fffffffffffffb0a,
                                                           in_stack_fffffffffffffb08)))))) + 1);
                                            }
                                            if (bVar4) {
                                              s->type = hike;
                                              this_00 = local_4c0;
                                            }
                                            else {
                                              pbVar7 = nlohmann::detail::
                                                                                                              
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                              in_stack_fffffffffffffb08 = 0x6f4e;
                                              in_stack_fffffffffffffb0a = 'r';
                                              in_stack_fffffffffffffb0b = 'd';
                                              in_stack_fffffffffffffb0c = 'i';
                                              in_stack_fffffffffffffb0d = 'c';
                                              in_stack_fffffffffffffb0e = ' ';
                                              in_stack_fffffffffffffb0f = 'S';
                                              in_stack_fffffffffffffb10 = 'k';
                                              in_stack_fffffffffffffb11 = 'i';
                                              in_stack_fffffffffffffb00._M_node = (_Base_ptr)0xa;
                                              in_stack_fffffffffffffb12 = '\0';
                                              _Var13._M_p = (pointer)&stack0xfffffffffffffb08;
                                              nlohmann::
                                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                              ::
                                              basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                        (&local_4d0,
                                                         (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                              bVar4 = nlohmann::operator==(pbVar7,&local_4d0);
                                              nlohmann::
                                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                              ::~basic_json(&local_4d0);
                                              if ((pointer)_Var13._M_p !=
                                                  (pointer)&stack0xfffffffffffffb08) {
                                                operator_delete(_Var13._M_p,
                                                                CONCAT17(in_stack_fffffffffffffb0f,
                                                                         CONCAT16(
                                                  in_stack_fffffffffffffb0e,
                                                  CONCAT15(in_stack_fffffffffffffb0d,
                                                           CONCAT14(in_stack_fffffffffffffb0c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffb0b,
                                                  CONCAT12(in_stack_fffffffffffffb0a,
                                                           in_stack_fffffffffffffb08)))))) + 1);
                                              }
                                              if (bVar4) {
                                                s->type = nordicSki;
                                                this_00 = local_4c0;
                                              }
                                              else {
                                                pbVar7 = nlohmann::detail::
                                                                                                                  
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                in_stack_fffffffffffffb08 = 0x6952;
                                                in_stack_fffffffffffffb0a = 'd';
                                                in_stack_fffffffffffffb0b = 'e';
                                                in_stack_fffffffffffffb00._M_node = (_Base_ptr)0x4;
                                                in_stack_fffffffffffffb0c = '\0';
                                                _Var13._M_p = (pointer)&stack0xfffffffffffffb08;
                                                nlohmann::
                                                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                ::
                                                basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                          (&local_4d0,
                                                           (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                                bVar4 = nlohmann::operator==(pbVar7,&local_4d0);
                                                nlohmann::
                                                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                ::~basic_json(&local_4d0);
                                                if ((pointer)_Var13._M_p !=
                                                    (pointer)&stack0xfffffffffffffb08) {
                                                  operator_delete(_Var13._M_p,
                                                                  CONCAT17(in_stack_fffffffffffffb0f
                                                                           ,CONCAT16(
                                                  in_stack_fffffffffffffb0e,
                                                  CONCAT15(in_stack_fffffffffffffb0d,
                                                           CONCAT14(in_stack_fffffffffffffb0c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffb0b,
                                                  CONCAT12(in_stack_fffffffffffffb0a,
                                                           in_stack_fffffffffffffb08)))))) + 1);
                                                }
                                                if (bVar4) {
                                                  s->type = ride;
                                                  this_00 = local_4c0;
                                                }
                                                else {
                                                  pbVar7 = nlohmann::detail::
                                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  in_stack_fffffffffffffb0a = 'n';
                                                  in_stack_fffffffffffffb08 = 0x7552;
                                                  in_stack_fffffffffffffb00._M_node = (_Base_ptr)0x3
                                                  ;
                                                  in_stack_fffffffffffffb0b = '\0';
                                                  _Var13._M_p = (pointer)&stack0xfffffffffffffb08;
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::
                                                  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                            (&local_4d0,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                                  bVar4 = nlohmann::operator==(pbVar7,&local_4d0);
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::~basic_json(&local_4d0);
                                                  if ((pointer)_Var13._M_p !=
                                                      (pointer)&stack0xfffffffffffffb08) {
                                                    operator_delete(_Var13._M_p,
                                                                    CONCAT17(
                                                  in_stack_fffffffffffffb0f,
                                                  CONCAT16(in_stack_fffffffffffffb0e,
                                                           CONCAT15(in_stack_fffffffffffffb0d,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffb0c,
                                                  CONCAT13(in_stack_fffffffffffffb0b,
                                                           CONCAT12(in_stack_fffffffffffffb0a,
                                                                    in_stack_fffffffffffffb08))))))
                                                  + 1);
                                                  }
                                                  if (bVar4) {
                                                    s->type = run;
                                                    this_00 = local_4c0;
                                                  }
                                                  else {
                                                    pbVar7 = nlohmann::detail::
                                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  in_stack_fffffffffffffb08 = 0x6157;
                                                  in_stack_fffffffffffffb0a = 'l';
                                                  in_stack_fffffffffffffb0b = 'k';
                                                  in_stack_fffffffffffffb00._M_node = (_Base_ptr)0x4
                                                  ;
                                                  in_stack_fffffffffffffb0c = '\0';
                                                  _Var13._M_p = (pointer)&stack0xfffffffffffffb08;
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::
                                                  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                            (&local_4d0,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                                  bVar4 = nlohmann::operator==(pbVar7,&local_4d0);
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::~basic_json(&local_4d0);
                                                  if ((pointer)_Var13._M_p !=
                                                      (pointer)&stack0xfffffffffffffb08) {
                                                    operator_delete(_Var13._M_p,
                                                                    CONCAT17(
                                                  in_stack_fffffffffffffb0f,
                                                  CONCAT16(in_stack_fffffffffffffb0e,
                                                           CONCAT15(in_stack_fffffffffffffb0d,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffb0c,
                                                  CONCAT13(in_stack_fffffffffffffb0b,
                                                           CONCAT12(in_stack_fffffffffffffb0a,
                                                                    in_stack_fffffffffffffb08))))))
                                                  + 1);
                                                  }
                                                  this_00 = local_4c0;
                                                  if (!bVar4) {
                                                    s->filterType = false;
                                                    std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                             "\nWarning:  unknown type value ",0x1e)
                                                  ;
                                                  pbVar7 = nlohmann::detail::
                                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  poVar9 = nlohmann::operator<<
                                                                     ((ostream *)&std::cout,pbVar7);
                                                  lVar11 = 0x24;
                                                  pcVar12 = ", defaulting to all activity types.\n";
                                                  goto LAB_0010a7b7;
                                                  }
                                                  s->type = walk;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                          else {
                                            pkVar6 = nlohmann::detail::
                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::key(&local_50);
                                            sVar1 = pkVar6->_M_string_length;
                                            if ((sVar1 == local_2c8) &&
                                               (((sVar1 == 0 ||
                                                 (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,local_2d0,
                                                               sVar1), iVar5 == 0)) &&
                                                (pbVar7 = nlohmann::detail::
                                                                                                                    
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50), pbVar7->m_type == string))
                                               )) {
                                              pbVar7 = nlohmann::detail::
                                                                                                              
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                              in_stack_fffffffffffffb08 = 0x6c65;
                                              in_stack_fffffffffffffb0a = 'e';
                                              in_stack_fffffffffffffb0b = 'v';
                                              in_stack_fffffffffffffb0c = 'a';
                                              in_stack_fffffffffffffb0d = 't';
                                              in_stack_fffffffffffffb0e = 'i';
                                              in_stack_fffffffffffffb0f = 'o';
                                              in_stack_fffffffffffffb10 = 'n';
                                              in_stack_fffffffffffffb00._M_node = (_Base_ptr)0x9;
                                              in_stack_fffffffffffffb11 = '\0';
                                              _Var13._M_p = (pointer)&stack0xfffffffffffffb08;
                                              nlohmann::
                                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                              ::
                                              basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                        (&local_4d0,
                                                         (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                              bVar4 = nlohmann::operator==(pbVar7,&local_4d0);
                                              nlohmann::
                                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                              ::~basic_json(&local_4d0);
                                              if ((pointer)_Var13._M_p !=
                                                  (pointer)&stack0xfffffffffffffb08) {
                                                operator_delete(_Var13._M_p,
                                                                CONCAT17(in_stack_fffffffffffffb0f,
                                                                         CONCAT16(
                                                  in_stack_fffffffffffffb0e,
                                                  CONCAT15(in_stack_fffffffffffffb0d,
                                                           CONCAT14(in_stack_fffffffffffffb0c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffb0b,
                                                  CONCAT12(in_stack_fffffffffffffb0a,
                                                           in_stack_fffffffffffffb08)))))) + 1);
                                              }
                                              if (bVar4) {
                                                s->mapType = elevation;
                                                this_00 = local_4c0;
                                              }
                                              else {
                                                pbVar7 = nlohmann::detail::
                                                                                                                  
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                in_stack_fffffffffffffb08 = 0x7267;
                                                in_stack_fffffffffffffb0a = 'a';
                                                in_stack_fffffffffffffb0b = 'd';
                                                in_stack_fffffffffffffb0c = 'i';
                                                in_stack_fffffffffffffb0d = 'e';
                                                in_stack_fffffffffffffb0e = 'n';
                                                in_stack_fffffffffffffb0f = 't';
                                                in_stack_fffffffffffffb00._M_node = (_Base_ptr)0x8;
                                                in_stack_fffffffffffffb10 = false;
                                                _Var13._M_p = (pointer)&stack0xfffffffffffffb08;
                                                nlohmann::
                                                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                ::
                                                basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                          (&local_4d0,
                                                           (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                                bVar4 = nlohmann::operator==(pbVar7,&local_4d0);
                                                nlohmann::
                                                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                ::~basic_json(&local_4d0);
                                                if ((pointer)_Var13._M_p !=
                                                    (pointer)&stack0xfffffffffffffb08) {
                                                  operator_delete(_Var13._M_p,
                                                                  CONCAT17(in_stack_fffffffffffffb0f
                                                                           ,CONCAT16(
                                                  in_stack_fffffffffffffb0e,
                                                  CONCAT15(in_stack_fffffffffffffb0d,
                                                           CONCAT14(in_stack_fffffffffffffb0c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffb0b,
                                                  CONCAT12(in_stack_fffffffffffffb0a,
                                                           in_stack_fffffffffffffb08)))))) + 1);
                                                }
                                                if (bVar4) {
                                                  s->mapType = gradient;
                                                  this_00 = local_4c0;
                                                }
                                                else {
                                                  pbVar7 = nlohmann::detail::
                                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  in_stack_fffffffffffffb08 = 0x6568;
                                                  in_stack_fffffffffffffb0a = 'a';
                                                  in_stack_fffffffffffffb0b = 't';
                                                  in_stack_fffffffffffffb00._M_node = (_Base_ptr)0x4
                                                  ;
                                                  in_stack_fffffffffffffb0c = '\0';
                                                  _Var13._M_p = (pointer)&stack0xfffffffffffffb08;
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::
                                                  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                            (&local_4d0,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                                  bVar4 = nlohmann::operator==(pbVar7,&local_4d0);
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::~basic_json(&local_4d0);
                                                  if ((pointer)_Var13._M_p !=
                                                      (pointer)&stack0xfffffffffffffb08) {
                                                    operator_delete(_Var13._M_p,
                                                                    CONCAT17(
                                                  in_stack_fffffffffffffb0f,
                                                  CONCAT16(in_stack_fffffffffffffb0e,
                                                           CONCAT15(in_stack_fffffffffffffb0d,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffb0c,
                                                  CONCAT13(in_stack_fffffffffffffb0b,
                                                           CONCAT12(in_stack_fffffffffffffb0a,
                                                                    in_stack_fffffffffffffb08))))))
                                                  + 1);
                                                  }
                                                  this_00 = local_4c0;
                                                  if (!bVar4) {
                                                    std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                             "\nWarning:  unknown map type value ",
                                                             0x22);
                                                  pbVar7 = nlohmann::detail::
                                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  poVar9 = nlohmann::operator<<
                                                                     ((ostream *)&std::cout,pbVar7);
                                                  lVar11 = 0x1a;
                                                  pcVar12 = ", defaulting to heat map.\n";
                                                  goto LAB_0010a7b7;
                                                  }
                                                  s->mapType = heat;
                                                }
                                              }
                                            }
                                            else {
                                              pkVar6 = nlohmann::detail::
                                                                                                              
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::key(&local_50);
                                              sVar1 = pkVar6->_M_string_length;
                                              if (((sVar1 == local_450) &&
                                                  ((sVar1 == 0 ||
                                                   (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,
                                                                 local_458,sVar1), iVar5 == 0)))) &&
                                                 (pbVar7 = nlohmann::detail::
                                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50), pbVar7->m_type == string))
                                              {
                                                s->filterAfter = true;
                                                pbVar7 = nlohmann::detail::
                                                                                                                  
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                nlohmann::
                                                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                ::
                                                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                          (local_b0,pbVar7);
                                                str._M_string_length =
                                                     (size_type)in_stack_fffffffffffffb00._M_node;
                                                str._M_dataplus._M_p = _Var13._M_p;
                                                str.field_2._M_allocated_capacity._0_2_ =
                                                     in_stack_fffffffffffffb08;
                                                str.field_2._M_local_buf[2] =
                                                     in_stack_fffffffffffffb0a;
                                                str.field_2._M_local_buf[3] =
                                                     in_stack_fffffffffffffb0b;
                                                str.field_2._M_local_buf[4] =
                                                     in_stack_fffffffffffffb0c;
                                                str.field_2._M_local_buf[5] =
                                                     in_stack_fffffffffffffb0d;
                                                str.field_2._M_local_buf[6] =
                                                     in_stack_fffffffffffffb0e;
                                                str.field_2._M_local_buf[7] =
                                                     in_stack_fffffffffffffb0f;
                                                str.field_2._M_local_buf[8] =
                                                     in_stack_fffffffffffffb10;
                                                str.field_2._M_local_buf[9] =
                                                     in_stack_fffffffffffffb11;
                                                str.field_2._M_local_buf[10] =
                                                     in_stack_fffffffffffffb12;
                                                str.field_2._11_5_ = in_stack_fffffffffffffb13;
                                                str2tm((tm *)&stack0xfffffffffffffaf8,str);
                                                local_4a0->tm_zone = local_4d8;
                                                uVar3 = CONCAT13(in_stack_fffffffffffffb0b,
                                                                 CONCAT12(in_stack_fffffffffffffb0a,
                                                                          in_stack_fffffffffffffb08)
                                                                );
                                                local_4a0->tm_isdst = local_4e8;
                                                *(undefined4 *)&local_4a0->field_0x24 = uStack_4e4;
                                                local_4a0->tm_gmtoff = lStack_4e0;
                                                local_4a0->tm_mon = uVar3;
                                                local_4a0->tm_year =
                                                     (int)(CONCAT17(in_stack_fffffffffffffb0f,
                                                                    CONCAT16(
                                                  in_stack_fffffffffffffb0e,
                                                  CONCAT15(in_stack_fffffffffffffb0d,
                                                           CONCAT14(in_stack_fffffffffffffb0c,uVar3)
                                                          ))) >> 0x20);
                                                local_4a0->tm_wday =
                                                     (int)CONCAT53(in_stack_fffffffffffffb13,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffb12,
                                                  CONCAT11(in_stack_fffffffffffffb11,
                                                           in_stack_fffffffffffffb10)));
                                                local_4a0->tm_yday =
                                                     (int)((uint5)in_stack_fffffffffffffb13 >> 8);
                                                *(pointer *)local_4a0 = _Var13._M_p;
                                                *(_Base_ptr *)&local_4a0->tm_hour =
                                                     in_stack_fffffffffffffb00._M_node;
                                                if (local_b0[0] != local_a0) {
                                                  operator_delete(local_b0[0],local_a0[0] + 1);
                                                }
                                                tVar8 = mktime((tm *)local_4a0);
                                                *local_110 = tVar8;
                                              }
                                              else {
                                                pkVar6 = nlohmann::detail::
                                                                                                                  
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::key(&local_50);
                                                sVar1 = pkVar6->_M_string_length;
                                                if ((sVar1 == local_470) &&
                                                   (((sVar1 == 0 ||
                                                     (iVar5 = bcmp((pkVar6->_M_dataplus)._M_p,
                                                                   local_478,sVar1), iVar5 == 0)) &&
                                                    (pbVar7 = nlohmann::detail::
                                                                                                                            
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50), pbVar7->m_type == string))
                                                  )) {
                                                  s->filterBefore = true;
                                                  pbVar7 = nlohmann::detail::
                                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::
                                                  get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                            (local_d0,pbVar7);
                                                  str_00._M_string_length =
                                                       (size_type)in_stack_fffffffffffffb00._M_node;
                                                  str_00._M_dataplus._M_p = _Var13._M_p;
                                                  str_00.field_2._M_allocated_capacity._0_2_ =
                                                       in_stack_fffffffffffffb08;
                                                  str_00.field_2._M_local_buf[2] =
                                                       in_stack_fffffffffffffb0a;
                                                  str_00.field_2._M_local_buf[3] =
                                                       in_stack_fffffffffffffb0b;
                                                  str_00.field_2._M_local_buf[4] =
                                                       in_stack_fffffffffffffb0c;
                                                  str_00.field_2._M_local_buf[5] =
                                                       in_stack_fffffffffffffb0d;
                                                  str_00.field_2._M_local_buf[6] =
                                                       in_stack_fffffffffffffb0e;
                                                  str_00.field_2._M_local_buf[7] =
                                                       in_stack_fffffffffffffb0f;
                                                  str_00.field_2._M_local_buf[8] =
                                                       in_stack_fffffffffffffb10;
                                                  str_00.field_2._M_local_buf[9] =
                                                       in_stack_fffffffffffffb11;
                                                  str_00.field_2._M_local_buf[10] =
                                                       in_stack_fffffffffffffb12;
                                                  str_00.field_2._11_5_ = in_stack_fffffffffffffb13;
                                                  str2tm((tm *)&stack0xfffffffffffffaf8,str_00);
                                                  local_4a8->tm_zone = local_4d8;
                                                  uVar3 = CONCAT13(in_stack_fffffffffffffb0b,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffb0a,
                                                  in_stack_fffffffffffffb08));
                                                  local_4a8->tm_isdst = local_4e8;
                                                  *(undefined4 *)&local_4a8->field_0x24 = uStack_4e4
                                                  ;
                                                  local_4a8->tm_gmtoff = lStack_4e0;
                                                  local_4a8->tm_mon = uVar3;
                                                  local_4a8->tm_year =
                                                       (int)(CONCAT17(in_stack_fffffffffffffb0f,
                                                                      CONCAT16(
                                                  in_stack_fffffffffffffb0e,
                                                  CONCAT15(in_stack_fffffffffffffb0d,
                                                           CONCAT14(in_stack_fffffffffffffb0c,uVar3)
                                                          ))) >> 0x20);
                                                  local_4a8->tm_wday =
                                                       (int)CONCAT53(in_stack_fffffffffffffb13,
                                                                     CONCAT12(
                                                  in_stack_fffffffffffffb12,
                                                  CONCAT11(in_stack_fffffffffffffb11,
                                                           in_stack_fffffffffffffb10)));
                                                  local_4a8->tm_yday =
                                                       (int)((uint5)in_stack_fffffffffffffb13 >> 8);
                                                  *(pointer *)local_4a8 = _Var13._M_p;
                                                  *(_Base_ptr *)&local_4a8->tm_hour =
                                                       in_stack_fffffffffffffb00._M_node;
                                                  if (local_d0[0] != local_c0) {
                                                    operator_delete(local_d0[0],local_c0[0] + 1);
                                                  }
                                                  tVar8 = mktime((tm *)local_4a8);
                                                  s->before = tVar8;
                                                }
                                                else {
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                             "\nWarning:  unknown JSON key \"",0x1d)
                                                  ;
                                                  pkVar6 = nlohmann::detail::
                                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::key(&local_50);
                                                  poVar9 = std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                             (pkVar6->_M_dataplus)._M_p,
                                                             pkVar6->_M_string_length);
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            (poVar9,"\" with value \"",0xe);
                                                  pbVar7 = nlohmann::detail::
                                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  poVar9 = nlohmann::operator<<(poVar9,pbVar7);
                                                  lVar11 = 2;
                                                  pcVar12 = "\"\n";
LAB_0010a7b7:
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            (poVar9,pcVar12,lVar11);
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                  goto LAB_0010a4bf;
                                }
                                pbVar7 = nlohmann::detail::
                                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                         ::operator*(&local_50);
                                nlohmann::
                                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                ::
                                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                          (&stack0xfffffffffffffaf8,pbVar7);
                                this = (string *)&local_498;
                              }
                            }
                          }
                          std::__cxx11::string::operator=(this,(string *)&stack0xfffffffffffffaf8);
                          if ((pointer)_Var13._M_p != (pointer)&stack0xfffffffffffffb08)
                          goto LAB_0010a030;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_0010a4bf:
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++(&local_50);
  }
  bVar4 = true;
  if ((((local_4ac & 1) != 0) && ((local_4b0 & 1) != 0)) && ((local_4b4 & 1) != 0)) {
    bVar4 = (bool)(~(byte)local_4b8 & 1);
  }
  s->fit = bVar4;
  if (s->mapType != heat) {
    s->sampling = linear;
    s->kernel = cylinder;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Image size",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,s->nx);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,s->ny);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_378,local_370);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," = \"",4);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(s->fname)._M_dataplus._M_p,(s->fname)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"\n",2);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_398,local_390);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," = \"",4);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(s->fgpx)._M_dataplus._M_p,(s->fgpx)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"\n",2);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_270,local_268);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," = \"",4);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(s->cmapFile)._M_dataplus._M_p,(s->cmapFile)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"\n",2);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_3b8,local_3b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," = \"",4);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_498,local_490);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"\n",2);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_3d8,local_3d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," = \"",4);
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"\n",2);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_3f8,local_3f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,(s->c).imap);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_290,local_288);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_2f8,local_2f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,s->verb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_318,local_310);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
  getSamplingName_abi_cxx11_((string *)&stack0xfffffffffffffaf8,s->sampling);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,_Var13._M_p,(long)in_stack_fffffffffffffb00._M_node);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  if ((pointer)_Var13._M_p != (pointer)&stack0xfffffffffffffb08) {
    operator_delete(_Var13._M_p,
                    CONCAT17(in_stack_fffffffffffffb0f,
                             CONCAT16(in_stack_fffffffffffffb0e,
                                      CONCAT15(in_stack_fffffffffffffb0d,
                                               CONCAT14(in_stack_fffffffffffffb0c,
                                                        CONCAT13(in_stack_fffffffffffffb0b,
                                                                 CONCAT12(in_stack_fffffffffffffb0a,
                                                                          in_stack_fffffffffffffb08)
                                                                ))))) + 1);
  }
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_190,local_188);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,s->r);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_2b0,local_2a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
  poVar9 = std::ostream::_M_insert<double>(s->gka);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_418,local_410);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
  getKernelName_abi_cxx11_((string *)&stack0xfffffffffffffaf8,s->kernel);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,_Var13._M_p,(long)in_stack_fffffffffffffb00._M_node);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  if ((pointer)_Var13._M_p != (pointer)&stack0xfffffffffffffb08) {
    operator_delete(_Var13._M_p,
                    CONCAT17(in_stack_fffffffffffffb0f,
                             CONCAT16(in_stack_fffffffffffffb0e,
                                      CONCAT15(in_stack_fffffffffffffb0d,
                                               CONCAT14(in_stack_fffffffffffffb0c,
                                                        CONCAT13(in_stack_fffffffffffffb0b,
                                                                 CONCAT12(in_stack_fffffffffffffb0a,
                                                                          in_stack_fffffffffffffb08)
                                                                ))))) + 1);
  }
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_210,local_208);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
  poVar9 = std::ostream::_M_insert<double>(s->margin);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_230,local_228);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_338,local_330);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_250,local_248);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_358,local_350);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_2d0,local_2c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
  getMapTypeName_abi_cxx11_((string *)&stack0xfffffffffffffaf8,s->mapType);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,_Var13._M_p,(long)in_stack_fffffffffffffb00._M_node);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  if ((pointer)_Var13._M_p != (pointer)&stack0xfffffffffffffb08) {
    operator_delete(_Var13._M_p,
                    CONCAT17(in_stack_fffffffffffffb0f,
                             CONCAT16(in_stack_fffffffffffffb0e,
                                      CONCAT15(in_stack_fffffffffffffb0d,
                                               CONCAT14(in_stack_fffffffffffffb0c,
                                                        CONCAT13(in_stack_fffffffffffffb0b,
                                                                 CONCAT12(in_stack_fffffffffffffb0a,
                                                                          in_stack_fffffffffffffb08)
                                                                ))))) + 1);
  }
  if (s->filterType == true) {
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_438,local_430);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
    getTypeName_abi_cxx11_((string *)&stack0xfffffffffffffaf8,s->type);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,_Var13._M_p,(long)in_stack_fffffffffffffb00._M_node);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    if ((pointer)_Var13._M_p != (pointer)&stack0xfffffffffffffb08) {
      operator_delete(_Var13._M_p,
                      CONCAT17(in_stack_fffffffffffffb0f,
                               CONCAT16(in_stack_fffffffffffffb0e,
                                        CONCAT15(in_stack_fffffffffffffb0d,
                                                 CONCAT14(in_stack_fffffffffffffb0c,
                                                          CONCAT13(in_stack_fffffffffffffb0b,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffb0a,
                                                  in_stack_fffffffffffffb08)))))) + 1);
    }
  }
  if (s->filterAfter == true) {
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_458,local_450);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
    __f._M_fmt = "%c";
    __f._M_tmb = local_4a0;
    pbVar10 = std::operator<<(poVar9,__f);
    std::__ostream_insert<char,std::char_traits<char>>(pbVar10,"\n",1);
  }
  if (s->filterBefore == true) {
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_478,local_470);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
    __f_00._M_fmt = "%c";
    __f_00._M_tmb = local_4a8;
    pbVar10 = std::operator<<(poVar9,__f_00);
    std::__ostream_insert<char,std::char_traits<char>>(pbVar10,"\n",1);
  }
  if (s->fit == false) {
    printBounds(s);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  iVar5 = std::__cxx11::string::compare((char *)local_2d8);
  if ((iVar5 != 0) &&
     ((iVar5 = std::__cxx11::string::compare((char *)&local_498), iVar5 != 0 ||
      (s->allCmaps == true)))) {
    if (s->allCmaps == true) {
      paVar14 = &local_70.field_2;
      pcVar2 = (s->cmapFile)._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)paVar14;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + (s->cmapFile)._M_string_length);
      iVar5 = irwincolor::loadMapNames(&local_70,&s->mapNames);
      _Var13._M_p = local_70._M_dataplus._M_p;
    }
    else {
      paVar14 = &local_90.field_2;
      pcVar2 = (s->cmapFile)._M_dataplus._M_p;
      local_90._M_dataplus._M_p = (pointer)paVar14;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar2,pcVar2 + (s->cmapFile)._M_string_length);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_498,(long)local_498 + local_490);
      iVar5 = irwincolor::Map::load(&s->c,&local_90,&local_f0);
      _Var13._M_p = local_90._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        _Var13._M_p = local_90._M_dataplus._M_p;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var13._M_p != paVar14) {
      operator_delete(_Var13._M_p,paVar14->_M_allocated_capacity + 1);
    }
    if (iVar5 != 0) goto LAB_0010b85c;
  }
  iVar5 = 0;
LAB_0010b85c:
  if (local_2d0 != local_2c0) {
    operator_delete(local_2d0,local_2c0[0] + 1);
  }
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  if (local_458 != local_448) {
    operator_delete(local_458,local_448[0] + 1);
  }
  if (local_438 != local_428) {
    operator_delete(local_438,local_428[0] + 1);
  }
  if (local_418 != local_408) {
    operator_delete(local_418,local_408[0] + 1);
  }
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0,local_2a0[0] + 1);
  }
  if (local_290 != local_280) {
    operator_delete(local_290,local_280[0] + 1);
  }
  if (local_3f8 != local_3e8) {
    operator_delete(local_3f8,local_3e8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  if (local_3b8 != local_3a8) {
    operator_delete(local_3b8,local_3a8[0] + 1);
  }
  if (local_270 != local_260) {
    operator_delete(local_270,local_260[0] + 1);
  }
  if (local_398 != local_388) {
    operator_delete(local_398,local_388[0] + 1);
  }
  if (local_378 != local_368) {
    operator_delete(local_378,local_368[0] + 1);
  }
  if (local_358 != local_348) {
    operator_delete(local_358,local_348[0] + 1);
  }
  if (local_250 != local_240) {
    operator_delete(local_250,local_240[0] + 1);
  }
  if (local_338 != local_328) {
    operator_delete(local_338,local_328[0] + 1);
  }
  if (local_230 != local_220) {
    operator_delete(local_230,local_220[0] + 1);
  }
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  if (local_190 != local_180) {
    operator_delete(local_190,local_180[0] + 1);
  }
  if (local_318 != local_308) {
    operator_delete(local_318,local_308[0] + 1);
  }
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8,local_2e8[0] + 1);
  }
  if (local_170 != local_160) {
    operator_delete(local_170,local_160[0] + 1);
  }
  if (local_150 != local_140) {
    operator_delete(local_150,local_140[0] + 1);
  }
  if (local_498 != local_488) {
    operator_delete(local_498,local_488[0] + 1);
  }
  return iVar5;
}

Assistant:

int loadSettings(Settings& s, json& inj, std::string& fjson)
{
	// Initial defaults
	s.nx = 1280;
	s.ny = 720;
	s.verb = 0;
	s.sampling = autosample;
	s.r = 10;
	s.minx = 0.0;
	s.miny = 0.0;
	s.maxx = 0.0;
	s.maxy = 0.0;
	s.margin = 0.0;
	s.fitx = false;
	s.fity = false;
	s.fitnx = false;
	s.fitny = false;
	s.fname = fjson.substr(0, fjson.find_last_of("."));
	s.fgpx = "*.gpx";
	s.cmapFile = "";
	std::string cmapName = "";
	s.allCmaps = false;
	s.gka = 10.0;
	s.kernel = cone;
	s.filterType = false;
	s.filterAfter = false;
	s.after = 0;
	s.filterBefore = false;
	s.before = 0;
	s.mapType = heat;

	bool bminx = false, bminy = false, bmaxx = false, bmaxy = false;

	// JSON keys
	const std::string sizexId = "Image size x";
	const std::string sizeyId = "Image size y";
	const std::string verbId = "Verbosity";
	const std::string sampleId = "Sampling";
	const std::string radiusId = "Kernel radius";
	const std::string minxId = "Min x";
	const std::string minyId = "Min y";
	const std::string maxxId = "Max x";
	const std::string maxyId = "Max y";
	const std::string marginId = "Margin";
	const std::string fitxId = "Fit x";
	const std::string fityId = "Fit y";
	const std::string fitnxId = "Fit nx";
	const std::string fitnyId = "Fit ny";
	const std::string fnameId = "File name prefix";
	const std::string fgpxId = "GPX files";
	const std::string cmapFileId = "Colormap file";
	const std::string cmapNameId = "Colormap name";
	const std::string allCmapsId = "All colormaps";
	const std::string imapId = "Color map";
	const std::string invertMapId = "Invert color map";
	const std::string gaussianAmpId = "Gaussian amplitude";
	const std::string kernelId = "Kernel";
	const std::string typeId = "Type";
	const std::string afterId = "After";
	const std::string beforeId = "Before";
	const std::string mapTypeId = "Map type";

	for (json::iterator it = inj.begin(); it != inj.end(); it++)
	{
		//std::cout << "\nkey = " << it.key();
		if (it.key() == sizexId && it.value().is_number())
		{
			s.nx = it.value();
		}
		else if (it.key() == sizeyId && it.value().is_number())
		{
			s.ny = it.value();
		}
		else if (it.key() == verbId && it.value().is_number())
		{
			s.verb = it.value();
		}
		else if (it.key() == sampleId
				&& (it.value().is_number() || it.value().is_string()))
		{
			if (it.value().is_number())
				s.sampling = it.value();
			else
			{
				if (it.value() == getSamplingName(pointwise))
					s.sampling = pointwise;
				else if (it.value() == getSamplingName(linear))
					s.sampling = linear;
				else if (it.value() == getSamplingName(autosample))
					s.sampling = autosample;
				else
					std::cout << "\nWarning:  unknown sampling value "
							<< it.value() << ", defaulting to \""
							<< getSamplingName(autosample) << "\"\n";
			}
		}
		else if (it.key() == radiusId && it.value().is_number())
		{
			s.r = it.value();
		}
		else if (it.key() == minxId && it.value().is_number())
		{
			s.minx = it.value();
			bminx = true;
		}
		else if (it.key() == minyId && it.value().is_number())
		{
			s.miny = it.value();
			bminy = true;
		}
		else if (it.key() == maxxId && it.value().is_number())
		{
			s.maxx = it.value();
			bmaxx = true;
		}
		else if (it.key() == maxyId && it.value().is_number())
		{
			s.maxy = it.value();
			bmaxy = true;
		}
		else if (it.key() == marginId && it.value().is_number())
		{
			s.margin = it.value();
		}
		else if (it.key() == fitxId && it.value().is_boolean())
		{
			s.fitx = it.value();
		}
		else if (it.key() == fityId && it.value().is_boolean())
		{
			s.fity = it.value();
		}
		else if (it.key() == fitnxId && it.value().is_boolean())
		{
			s.fitnx = it.value();
		}
		else if (it.key() == fitnyId && it.value().is_boolean())
		{
			s.fitny = it.value();
		}
		else if (it.key() == fnameId && it.value().is_string())
		{
			s.fname = it.value();
		}
		else if (it.key() == fgpxId && it.value().is_string())
		{
			s.fgpx = it.value();
		}
		else if (it.key() == cmapFileId && it.value().is_string())
		{
			s.cmapFile = it.value();
		}
		else if (it.key() == cmapNameId && it.value().is_string())
		{
			cmapName = it.value();
		}
		else if (it.key() == imapId && it.value().is_number())
		{
			s.c.imap = it.value();
		}
		else if (it.key() == invertMapId && it.value().is_boolean())
		{
			s.c.inv = it.value();
		}
		else if (it.key() == allCmapsId && it.value().is_boolean())
		{
			s.allCmaps = it.value();
		}
		else if (it.key() == gaussianAmpId && it.value().is_number())
		{
			s.gka = it.value();
		}
		else if (it.key() == kernelId && it.value().is_string())
		{
			if (it.value() == getKernelName(pyramid))
				s.kernel = pyramid;
			else if (it.value() == getKernelName(cylinder))
				s.kernel = cylinder;
			else if (it.value() == getKernelName(gaussian))
				s.kernel = gaussian;
			else if (it.value() == getKernelName(cone))
				s.kernel = cone;
			else
				std::cout << "\nWarning:  unknown kernel value "
						<< it.value() << ", defaulting to \""
						<< getKernelName(cone) << "\"\n";
		}
		else if (it.key() == typeId && it.value().is_string())
		{
			s.filterType = true;
			if (it.value() == getTypeName(hike))
				s.type = hike;
			else if (it.value() == getTypeName(nordicSki))
				s.type = nordicSki;
			else if (it.value() == getTypeName(ride))
				s.type = ride;
			else if (it.value() == getTypeName(run))
				s.type = run;
			else if (it.value() == getTypeName(walk))
				s.type = walk;
			else
			{
				s.filterType = false;
				std::cout << "\nWarning:  unknown type value "
						<< it.value() << ", defaulting to all activity types.\n";
			}
		}
		else if (it.key() == mapTypeId && it.value().is_string())
		{
			if (it.value() == getMapTypeName(elevation))
				s.mapType = elevation;
			else if (it.value() == getMapTypeName(gradient))
				s.mapType = gradient;
			else if (it.value() == getMapTypeName(heat))
				s.mapType = heat;
			else
			{
				std::cout << "\nWarning:  unknown map type value "
						<< it.value() << ", defaulting to heat map.\n";
			}
		}
		else if (it.key() == afterId && it.value().is_string())
		{
			s.filterAfter = true;
			s.aftertm = str2tm((std::string) it.value());
			s.after = mktime(&s.aftertm);
		}
		else if (it.key() == beforeId && it.value().is_string())
		{
			s.filterBefore = true;
			s.beforetm = str2tm((std::string) it.value());
			s.before = mktime(&s.beforetm);
		}
		else
		{
			std::cout << "\nWarning:  unknown JSON key \"" << it.key()
					<< "\" with value \"" << it.value() << "\"\n";
		}
	}

	s.fit = !(bminx && bminy && bmaxx && bmaxy);

	if (s.mapType != heat)
	{
		// Linear sampling, cylinder kernel only for non-heat maps
		s.sampling = linear;
		s.kernel = cylinder;
	}

	// Echo inputs
	std::cout << "\n";
	std::cout << "Image size" << " = " << s.nx << ", " << s.ny << "\n";
	std::cout << fnameId << " = \"" << s.fname << "\"\n";
	std::cout << fgpxId << " = \"" << s.fgpx << "\"\n";
	std::cout << cmapFileId << " = \"" << s.cmapFile << "\"\n";
	std::cout << cmapNameId << " = \"" << cmapName << "\"\n";
	std::cout << allCmapsId << " = \"" << s.allCmaps << "\"\n";
	std::cout << imapId << " = " << s.c.imap << "\n";
	std::cout << invertMapId << " = " << s.c.inv << "\n";
	std::cout << verbId << " = " << s.verb << "\n";
	std::cout << sampleId << " = " << getSamplingName(s.sampling) << "\n";
	std::cout << radiusId << " = " << s.r << "\n";
	std::cout << gaussianAmpId << " = " << s.gka << "\n";
	std::cout << kernelId << " = " << getKernelName(s.kernel) << "\n";
	std::cout << marginId << " = " << s.margin << "\n";
	std::cout << fitxId << " = " << s.fitx << "\n";
	std::cout << fityId << " = " << s.fity << "\n";
	std::cout << fitnxId << " = " << s.fitnx << "\n";
	std::cout << fitnyId << " = " << s.fitny << "\n";
	std::cout << mapTypeId << " = " << getMapTypeName(s.mapType) << "\n";

	if (s.filterType) std::cout << typeId << " = " << getTypeName(s.type) << "\n";

	if (s.filterAfter) std::cout << afterId << " = " << std::put_time(&s.aftertm, "%c") << "\n";
	if (s.filterBefore) std::cout << beforeId << " = " << std::put_time(&s.beforetm, "%c") << "\n";

	//std::cout << "s.fit = " << s.fit << "\n";
	if (!s.fit)
		printBounds(s);

	std::cout << std::endl;

	if (s.cmapFile != "" && (cmapName != "" || s.allCmaps))
	{
		int io;
		if (s.allCmaps)
		{
			io = irwincolor::loadMapNames(s.cmapFile, s.mapNames);
			//std::cout << "mapNames = " << s.mapNames << std::endl;
		}
		else
			io = s.c.load(s.cmapFile, cmapName);
		if (io != 0) return io;
	}
	return 0;
}